

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O3

basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_void>_>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>,_std::tuple<>_>
* __thiscall
nonsugar::
basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)72,void>>,std::tuple<>,std::tuple<>>
::
subcommand<(char)83,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<>>>
          (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_void>_>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>,_std::tuple<>_>
           *__return_storage_ptr__,void *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *help,
          basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
          *command)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>
  s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_void>_>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>,_std::tuple<>_>
  *local_c0;
  tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
  local_b8;
  
  pcVar4 = (name->_M_dataplus)._M_p;
  local_148 = &local_138;
  local_c0 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,pcVar4,pcVar4 + name->_M_string_length);
  local_128 = &local_118;
  pcVar4 = (help->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,pcVar4,pcVar4 + help->_M_string_length);
  local_108 = &local_f8;
  pcVar4 = (command->m_header)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar4,pcVar4 + (command->m_header)._M_string_length);
  pcVar4 = (command->m_footer)._M_dataplus._M_p;
  local_e8 = &local_d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,pcVar4,pcVar4 + (command->m_footer)._M_string_length);
  local_b8.
  super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
  .
  super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
  ._M_head_impl.name._M_dataplus._M_p =
       (pointer)&local_b8.
                 super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
                 .
                 super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
                 ._M_head_impl.name.field_2;
  if (local_148 == &local_138) {
    local_b8.
    super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
    .
    super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
    ._M_head_impl.name.field_2._8_8_ = local_138._8_8_;
  }
  else {
    local_b8.
    super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
    .
    super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
    ._M_head_impl.name._M_dataplus._M_p = (pointer)local_148;
  }
  local_b8.
  super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
  .
  super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
  ._M_head_impl.name.field_2._M_allocated_capacity._1_7_ = local_138._M_allocated_capacity._1_7_;
  local_b8.
  super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
  .
  super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
  ._M_head_impl.name.field_2._M_local_buf[0] = local_138._M_local_buf[0];
  paVar1 = &local_b8.
            super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
            .
            super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
            ._M_head_impl.help.field_2;
  local_b8.
  super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
  .
  super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
  ._M_head_impl.name._M_string_length = local_140;
  local_140 = 0;
  local_138._M_local_buf[0] = '\0';
  if (local_128 == &local_118) {
    local_b8.
    super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
    .
    super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
    ._M_head_impl.help.field_2._8_8_ = local_118._8_8_;
    local_b8.
    super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
    .
    super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
    ._M_head_impl.help._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b8.
    super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
    .
    super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
    ._M_head_impl.help._M_dataplus._M_p = (pointer)local_128;
  }
  local_b8.
  super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
  .
  super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
  ._M_head_impl.help.field_2._M_allocated_capacity._1_7_ = local_118._M_allocated_capacity._1_7_;
  local_b8.
  super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
  .
  super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
  ._M_head_impl.help.field_2._M_local_buf[0] = local_118._M_local_buf[0];
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)&local_b8.
                      super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
                      .
                      super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
                      ._M_head_impl.command.m_header + 0x10);
  local_b8.
  super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
  .
  super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
  ._M_head_impl.help._M_string_length = local_120;
  local_120 = 0;
  local_118._M_local_buf[0] = '\0';
  if (local_108 == &local_f8) {
    local_b8.
    super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
    .
    super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
    ._M_head_impl.command.m_header.field_2._8_8_ = local_f8._8_8_;
    local_b8.
    super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
    .
    super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
    ._M_head_impl.command.m_header._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_b8.
    super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
    .
    super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
    ._M_head_impl.command.m_header._M_dataplus._M_p = (pointer)local_108;
  }
  local_b8.
  super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
  .
  super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
  ._M_head_impl.command.m_header.field_2._M_allocated_capacity._1_7_ =
       local_f8._M_allocated_capacity._1_7_;
  local_b8.
  super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
  .
  super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
  ._M_head_impl.command.m_header.field_2._M_local_buf[0] = local_f8._M_local_buf[0];
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)&local_b8.
                      super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
                      .
                      super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
                      ._M_head_impl.command.m_footer + 0x10);
  local_b8.
  super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
  .
  super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
  ._M_head_impl.command.m_header._M_string_length = local_100;
  local_100 = 0;
  local_f8._M_local_buf[0] = '\0';
  if (local_e8 == &local_d8) {
    local_b8.
    super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
    .
    super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
    ._M_head_impl.command.m_footer.field_2._8_8_ = local_d8._8_8_;
    local_b8.
    super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
    .
    super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
    ._M_head_impl.command.m_footer._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_b8.
    super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
    .
    super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
    ._M_head_impl.command.m_footer._M_dataplus._M_p = (pointer)local_e8;
  }
  local_b8.
  super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
  .
  super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
  ._M_head_impl.command.m_footer.field_2._M_allocated_capacity._1_7_ =
       local_d8._M_allocated_capacity._1_7_;
  local_b8.
  super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
  .
  super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
  ._M_head_impl.command.m_footer.field_2._M_local_buf[0] = local_d8._M_local_buf[0];
  local_b8.
  super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
  .
  super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
  ._M_head_impl.command.m_footer._M_string_length = local_e0;
  local_e0 = 0;
  local_d8._M_local_buf[0] = '\0';
  local_148 = &local_138;
  local_128 = &local_118;
  local_108 = &local_f8;
  local_e8 = &local_d8;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'H',_void>_>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'S',_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>,_std::tuple<>_>
  ::basic_command(local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
                  ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)this + 0x20),
                  (tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_void>_>
                   *)((long)this + 0x40),&local_b8,(tuple<> *)((long)this + 0xe9));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.
         super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
         .
         super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
         ._M_head_impl.command.m_footer._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8.
                    super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
                    .
                    super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
                    ._M_head_impl.command.m_footer._M_dataplus._M_p,
                    local_b8.
                    super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
                    .
                    super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
                    ._M_head_impl.command.m_footer.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.
         super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
         .
         super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
         ._M_head_impl.command.m_header._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8.
                    super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
                    .
                    super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
                    ._M_head_impl.command.m_header._M_dataplus._M_p,
                    local_b8.
                    super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
                    .
                    super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
                    ._M_head_impl.command.m_header.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.
         super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
         .
         super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
         ._M_head_impl.help._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8.
                    super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
                    .
                    super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
                    ._M_head_impl.help._M_dataplus._M_p,
                    local_b8.
                    super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
                    .
                    super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
                    ._M_head_impl.help.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.
         super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
         .
         super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
         ._M_head_impl.name._M_dataplus._M_p !=
      &local_b8.
       super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
       .
       super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
       ._M_head_impl.name.field_2) {
    operator_delete(local_b8.
                    super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
                    .
                    super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
                    ._M_head_impl.name._M_dataplus._M_p,
                    local_b8.
                    super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>_>
                    .
                    super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>_>,_false>
                    ._M_head_impl.name.field_2._M_allocated_capacity + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0])
                             + 1);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108,
                    CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]) + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,
                    CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]) + 1);
  }
  if (local_148 != &local_138) {
    operator_delete(local_148,
                    CONCAT71(local_138._M_allocated_capacity._1_7_,local_138._M_local_buf[0]) + 1);
  }
  return local_c0;
}

Assistant:

auto subcommand(String const &name, String const &help, Command const &command) const
    {
        detail::subcommand<String, OptionType, Option, Command> s { name, help, command };
        return detail::make_command<String, OptionType>(
            m_header, m_footer, m_flags, detail::tuple_append(m_subcommands, std::move(s)),
            m_arguments);
    }